

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

bool helics::interfaceTypeMatch(InterfaceType given,InterfaceType expected)

{
  bool bVar1;
  
  bVar1 = true;
  if (given != expected) {
    if ((expected == ENDPOINT) || (expected == INPUT)) {
      return (byte)(given + 0x8d) < 2;
    }
    if (expected != PUBLICATION) {
      return false;
    }
    bVar1 = given == TRANSLATOR;
  }
  return bVar1;
}

Assistant:

static bool interfaceTypeMatch(InterfaceType given, InterfaceType expected)
{
    if (given == expected) {
        return true;
    }
    switch (expected) {
        case InterfaceType::PUBLICATION:
            return (given == InterfaceType::TRANSLATOR);
        case InterfaceType::INPUT:
        case InterfaceType::ENDPOINT:
            return (given == InterfaceType::TRANSLATOR || given == InterfaceType::SINK);
        default:
            break;
    }
    return false;
}